

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_component.cpp
# Opt level: O1

int __thiscall lsim::ModelComponent::copy(ModelComponent *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ModelCircuit *this_00;
  long *plVar1;
  __single_object clone;
  uptr_t local_30;
  
  this_00 = (ModelCircuit *)operator_new(200);
  ModelComponent((ModelComponent *)this_00,(ModelCircuit *)0x0,0xffffffff,
                 *(ComponentType *)(dst + 0xc),*(uint32_t *)(dst + 0x10),*(uint32_t *)(dst + 0x14),
                 *(uint32_t *)(dst + 0x18));
  std::__cxx11::string::_M_assign((string *)(this_00->m_name).field_2._M_local_buf);
  (this_00->m_components)._M_h._M_bucket_count = *(size_type *)(dst + 0x40);
  if (this_00 != (ModelCircuit *)dst) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this_00->m_components)._M_h._M_before_begin,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(dst + 0x48));
  }
  plVar1 = *(long **)(dst + 0x90);
  if (plVar1 != (long *)0x0) {
    do {
      (**(code **)(*(long *)plVar1[5] + 0x18))(&local_30);
      add_property((ModelComponent *)this_00,&local_30);
      if (local_30._M_t.super___uniq_ptr_impl<lsim::Property,_std::default_delete<lsim::Property>_>.
          _M_t.super__Tuple_impl<0UL,_lsim::Property_*,_std::default_delete<lsim::Property>_>.
          super__Head_base<0UL,_lsim::Property_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<lsim::Property,_std::default_delete<lsim::Property>_>)0x0) {
        (**(code **)(*(long *)local_30._M_t.
                              super___uniq_ptr_impl<lsim::Property,_std::default_delete<lsim::Property>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_lsim::Property_*,_std::default_delete<lsim::Property>_>
                              .super__Head_base<0UL,_lsim::Property_*,_false>._M_head_impl + 8))();
      }
      plVar1 = (long *)*plVar1;
    } while (plVar1 != (long *)0x0);
  }
  (this_00->m_ports_lut)._M_h._M_bucket_count = *(size_type *)(dst + 0xb8);
  *(undefined4 *)&(this_00->m_ports_lut)._M_h._M_before_begin._M_nxt = *(undefined4 *)(dst + 0xc0);
  this->m_circuit = this_00;
  return (int)this;
}

Assistant:

ModelComponent::uptr_t ModelComponent::copy() const {
    auto clone = std::make_unique<ModelComponent>(nullptr, -1, m_type, m_inputs, m_outputs, m_controls);
    clone->m_nested_name = m_nested_name;
    clone->m_nested_circuit = m_nested_circuit;
    clone->m_port_lut = m_port_lut;
    for (const auto &prop_it : m_properties) {
        clone->add_property(prop_it.second->clone());
    }
    clone->m_position = m_position;
    clone->m_angle = m_angle;

    return std::move(clone);
}